

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

_Bool str_is_printable(char *value)

{
  byte bVar1;
  bool bVar2;
  byte *local_20;
  uchar *_value;
  char *value_local;
  uchar uc;
  
  local_20 = (byte *)value;
  while( true ) {
    if (*local_20 == 0) {
      return true;
    }
    bVar1 = *local_20;
    bVar2 = true;
    if ((0x1f < bVar1) && (bVar2 = true, bVar1 != 0x7f)) {
      bVar2 = bVar1 == 0xff;
    }
    if (bVar2) break;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool
str_is_printable(const char *value) {
  const unsigned char *_value;

  _value = (const unsigned char *)value;

  while (*_value) {
    if (!str_char_is_printable(*_value)) {
      return false;
    }
    _value++;
  }
  return true;
}